

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O2

void __thiscall kj::_::Mutex::~Mutex(Mutex *this)

{
  Fault f;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = this->futex == 0;
  if (!_kjCondition.result) {
    _kjCondition.left = &this->futex;
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[30]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
               ,0xa4,FAILED,"futex == 0","_kjCondition,\"Mutex destroyed while locked.\"",
               &_kjCondition,(char (*) [30])"Mutex destroyed while locked.");
    Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

Mutex::~Mutex() {
  // This will crash anyway, might as well crash with a nice error message.
  KJ_ASSERT(futex == 0, "Mutex destroyed while locked.") { break; }
}